

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

aiNode * __thiscall
Assimp::XGLImporter::ReadObject(XGLImporter *this,TempScope *scope,bool skipFirst,char *closetag)

{
  bool bVar1;
  bool bVar2;
  aiNode *this_00;
  reference ppVar3;
  reference ppaVar4;
  size_type sVar5;
  uint *__s;
  reference pvVar6;
  aiNode **__s_00;
  reference ppaVar7;
  ulong uVar8;
  bool local_1a1;
  uint local_190;
  uint local_18c;
  uint i_3;
  uint i_2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_180;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_178;
  aiNode *ch;
  iterator __end2;
  iterator __begin2;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *__range2;
  uint local_110;
  value_type_conflict4 local_10c;
  uint mcount;
  uint i_1;
  aiMesh *m;
  string local_f8;
  _Self local_d8;
  iterator end;
  iterator it;
  aiNode *paStack_c0;
  uint id;
  value_type_conflict4 local_b4;
  ulong local_b0;
  size_t i;
  size_t newc;
  size_t prev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string *s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> meshes;
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  aiNode *nd;
  char *closetag_local;
  bool skipFirst_local;
  TempScope *scope_local;
  XGLImporter *this_local;
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
             &meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
  closetag_local._7_1_ = skipFirst;
  do {
    local_1a1 = true;
    if ((closetag_local._7_1_ & 1) == 0) {
      local_1a1 = ReadElementUpToClosing(this,closetag);
    }
    if (local_1a1 == false) {
      local_178._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
      local_180._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
      SortMeshByMaterialId::SortMeshByMaterialId((SortMeshByMaterialId *)&i_3,scope);
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,Assimp::XGLImporter::SortMeshByMaterialId>
                (local_178,local_180,_i_3);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
      this_00->mNumMeshes = (uint)sVar5;
      if (this_00->mNumMeshes != 0) {
        uVar8 = (ulong)this_00->mNumMeshes << 2;
        __s = (uint *)operator_new__(uVar8);
        memset(__s,0,uVar8);
        this_00->mMeshes = __s;
        for (local_18c = 0; local_18c < this_00->mNumMeshes; local_18c = local_18c + 1) {
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s,
                              (ulong)local_18c);
          this_00->mMeshes[local_18c] = *pvVar6;
        }
      }
      sVar5 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                        ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                         &meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00->mNumChildren = (uint)sVar5;
      if (this_00->mNumChildren != 0) {
        uVar8 = (ulong)this_00->mNumChildren << 3;
        __s_00 = (aiNode **)operator_new__(uVar8);
        memset(__s_00,0,uVar8);
        this_00->mChildren = __s_00;
        for (local_190 = 0; local_190 < this_00->mNumChildren; local_190 = local_190 + 1) {
          ppaVar7 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[]
                              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                               &meshes.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_190);
          this_00->mChildren[local_190] = *ppaVar7;
          ppaVar7 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::operator[]
                              ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                               &meshes.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_190);
          (*ppaVar7)->mParent = this_00;
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
                ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                 &meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return this_00;
    }
    closetag_local._7_1_ = 0;
    GetElementName_abi_cxx11_((string *)&prev,this);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prev;
    bVar1 = std::operator==(local_78,"mesh");
    if (bVar1) {
      newc = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&scope->meshes_linear);
      bVar1 = ReadMesh(this,scope);
      if (bVar1) {
        i = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&scope->meshes_linear);
        for (local_b0 = 0; local_b0 < i - newc; local_b0 = local_b0 + 1) {
          local_b4 = (int)local_b0 + (int)newc;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s,&local_b4);
        }
      }
    }
    else {
      bVar1 = std::operator==(local_78,"mat");
      if (bVar1) {
        ReadMaterial(this,scope);
      }
      else {
        bVar1 = std::operator==(local_78,"object");
        if (bVar1) {
          paStack_c0 = ReadObject(this,scope,false,"object");
          std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                    ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)
                     &meshes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,&stack0xffffffffffffff40);
        }
        else {
          bVar1 = std::operator==(local_78,"objectref");
          if (!bVar1) {
            bVar1 = std::operator==(local_78,"meshref");
            if (bVar1) {
              it._M_node._4_4_ = ReadIndexFromText(this);
              end = std::
                    multimap<unsigned_int,_aiMesh_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMesh_*>_>_>
                    ::find(&scope->meshes,(key_type *)((long)&it._M_node + 4));
              local_d8._M_node =
                   (_Base_ptr)
                   std::
                   multimap<unsigned_int,_aiMesh_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMesh_*>_>_>
                   ::end(&scope->meshes);
              bVar1 = std::operator==(&end,&local_d8);
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_f8,"<meshref> index out of range",
                           (allocator *)((long)&m + 7));
                LogFunctions<Assimp::XGLImporter>::ThrowException(&local_f8);
                std::__cxx11::string::~string((string *)&local_f8);
                std::allocator<char>::~allocator((allocator<char> *)((long)&m + 7));
              }
              while( true ) {
                bVar2 = std::operator!=(&end,&local_d8);
                bVar1 = false;
                if (bVar2) {
                  ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_aiMesh_*>_>::
                           operator*(&end);
                  bVar1 = ppVar3->first == it._M_node._4_4_;
                }
                if (!bVar1) break;
                ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_aiMesh_*>_>::operator*
                                   (&end);
                _mcount = ppVar3->second;
                local_10c = 0;
                sVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                                  (&scope->meshes_linear);
                local_110 = (uint)sVar5;
                for (; local_10c < local_110; local_10c = local_10c + 1) {
                  ppaVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                                      (&scope->meshes_linear,(ulong)local_10c);
                  if (*ppaVar4 == _mcount) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s,&local_10c)
                    ;
                    break;
                  }
                }
                if (local_110 <= local_10c) {
                  __assert_fail("i < mcount",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/XGL/XGLLoader.cpp"
                                ,0x1a4,
                                "aiNode *Assimp::XGLImporter::ReadObject(TempScope &, bool, const char *)"
                               );
                }
                std::_Rb_tree_iterator<std::pair<const_unsigned_int,_aiMesh_*>_>::operator++(&end);
              }
            }
            else {
              bVar1 = std::operator==(local_78,"transform");
              if (bVar1) {
                ReadTrafo((aiMatrix4x4 *)&__range2,this);
                memcpy(&this_00->mTransformation,&__range2,0x40);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&prev);
  } while( true );
}

Assistant:

aiNode* XGLImporter::ReadObject(TempScope& scope, bool skipFirst, const char* closetag)
{
    aiNode *nd = new aiNode;
    std::vector<aiNode*> children;
    std::vector<unsigned int> meshes;

    try {
        while (skipFirst || ReadElementUpToClosing(closetag))   {
            skipFirst = false;

            const std::string& s = GetElementName();
            if (s == "mesh") {
                const size_t prev = scope.meshes_linear.size();
                if(ReadMesh(scope)) {
                    const size_t newc = scope.meshes_linear.size();
                    for(size_t i = 0; i < newc-prev; ++i) {
                        meshes.push_back(static_cast<unsigned int>(i+prev));
                    }
                }
            }
            else if (s == "mat") {
                ReadMaterial(scope);
            }
            else if (s == "object") {
                children.push_back(ReadObject(scope));
            }
            else if (s == "objectref") {
                // XXX
            }
            else if (s == "meshref") {
                const unsigned int id = static_cast<unsigned int>( ReadIndexFromText() );

                std::multimap<unsigned int, aiMesh*>::iterator it = scope.meshes.find(id), end = scope.meshes.end();
                if (it == end) {
                    ThrowException("<meshref> index out of range");
                }

                for(; it != end && (*it).first == id; ++it) {
                    // ok, this is n^2 and should get optimized one day
                    aiMesh* const m = (*it).second;

                    unsigned int i = 0, mcount = static_cast<unsigned int>(scope.meshes_linear.size());
                    for(; i < mcount; ++i) {
                        if (scope.meshes_linear[i] == m) {
                            meshes.push_back(i);
                            break;
                        }
                    }

                    ai_assert(i < mcount);
                }
            }
            else if (s == "transform") {
                nd->mTransformation = ReadTrafo();
            }
        }

    } catch(...) {
        for(aiNode* ch : children) {
            delete ch;
        }
        throw;
    }

    // FIX: since we used std::multimap<> to keep meshes by id, mesh order now depends on the behaviour
    // of the multimap implementation with respect to the ordering of entries with same values.
    // C++11 gives the guarantee that it uses insertion order, before it is implementation-specific.
    // Sort by material id to always guarantee a deterministic result.
    std::sort(meshes.begin(), meshes.end(), SortMeshByMaterialId(scope));

    // link meshes to node
    nd->mNumMeshes = static_cast<unsigned int>(meshes.size());
    if (nd->mNumMeshes) {
        nd->mMeshes = new unsigned int[nd->mNumMeshes]();
        for(unsigned int i = 0; i < nd->mNumMeshes; ++i) {
            nd->mMeshes[i] = meshes[i];
        }
    }

    // link children to parent
    nd->mNumChildren = static_cast<unsigned int>(children.size());
    if (nd->mNumChildren) {
        nd->mChildren = new aiNode*[nd->mNumChildren]();
        for(unsigned int i = 0; i < nd->mNumChildren; ++i) {
            nd->mChildren[i] = children[i];
            children[i]->mParent = nd;
        }
    }

    return nd;
}